

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkleblock.cpp
# Opt level: O2

uint256 * __thiscall
CPartialMerkleTree::TraverseAndExtract
          (uint256 *__return_storage_ptr__,CPartialMerkleTree *this,int height,uint pos,
          uint *nBitsUsed,uint *nHashUsed,vector<uint256,_std::allocator<uint256>_> *vMatch,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *vnIndex)

{
  uint uVar1;
  long lVar2;
  pointer puVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  base_blob<256U> *pbVar7;
  bool bVar8;
  ulong uVar9;
  int height_00;
  value_type *__x;
  long in_FS_OFFSET;
  reference rVar10;
  uint pos_local;
  base_blob<256U> local_78;
  uint256 left;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = *nBitsUsed;
  pos_local = pos;
  if ((ulong)uVar1 <
      (ulong)(this->vBits).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
      ((long)(this->vBits).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
      (long)(this->vBits).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8) {
    *nBitsUsed = uVar1 + 1;
    rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->vBits,(ulong)uVar1);
    uVar9 = rVar10._M_mask & *rVar10._M_p;
    if ((height == 0) || (uVar9 == 0)) {
      uVar1 = *nHashUsed;
      puVar3 = (this->vHash).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->vHash).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar3 >> 5) <= (ulong)uVar1)
      goto LAB_0058016b;
      *nHashUsed = uVar1 + 1;
      __x = puVar3 + uVar1;
      if (uVar9 != 0 && height == 0) {
        std::vector<uint256,_std::allocator<uint256>_>::push_back(vMatch,__x);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(vnIndex,&pos_local);
      }
      uVar4 = *(undefined8 *)(__x->super_base_blob<256U>).m_data._M_elems;
      uVar5 = *(undefined8 *)((__x->super_base_blob<256U>).m_data._M_elems + 8);
      uVar6 = *(undefined8 *)((__x->super_base_blob<256U>).m_data._M_elems + 0x18);
      *(undefined8 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 0x10) =
           *(undefined8 *)((__x->super_base_blob<256U>).m_data._M_elems + 0x10);
      *(undefined8 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 0x18) =
           uVar6;
      *(undefined8 *)(__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems = uVar4;
      *(undefined8 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 8) = uVar5;
    }
    else {
      height_00 = height + -1;
      TraverseAndExtract(&left,this,height_00,pos * 2,nBitsUsed,nHashUsed,vMatch,vnIndex);
      local_78.m_data._M_elems[0x10] = '\0';
      local_78.m_data._M_elems[0x11] = '\0';
      local_78.m_data._M_elems[0x12] = '\0';
      local_78.m_data._M_elems[0x13] = '\0';
      local_78.m_data._M_elems[0x14] = '\0';
      local_78.m_data._M_elems[0x15] = '\0';
      local_78.m_data._M_elems[0x16] = '\0';
      local_78.m_data._M_elems[0x17] = '\0';
      local_78.m_data._M_elems[0x18] = '\0';
      local_78.m_data._M_elems[0x19] = '\0';
      local_78.m_data._M_elems[0x1a] = '\0';
      local_78.m_data._M_elems[0x1b] = '\0';
      local_78.m_data._M_elems[0x1c] = '\0';
      local_78.m_data._M_elems[0x1d] = '\0';
      local_78.m_data._M_elems[0x1e] = '\0';
      local_78.m_data._M_elems[0x1f] = '\0';
      local_78.m_data._M_elems[0] = '\0';
      local_78.m_data._M_elems[1] = '\0';
      local_78.m_data._M_elems[2] = '\0';
      local_78.m_data._M_elems[3] = '\0';
      local_78.m_data._M_elems[4] = '\0';
      local_78.m_data._M_elems[5] = '\0';
      local_78.m_data._M_elems[6] = '\0';
      local_78.m_data._M_elems[7] = '\0';
      local_78.m_data._M_elems[8] = '\0';
      local_78.m_data._M_elems[9] = '\0';
      local_78.m_data._M_elems[10] = '\0';
      local_78.m_data._M_elems[0xb] = '\0';
      local_78.m_data._M_elems[0xc] = '\0';
      local_78.m_data._M_elems[0xd] = '\0';
      local_78.m_data._M_elems[0xe] = '\0';
      local_78.m_data._M_elems[0xf] = '\0';
      uVar1 = pos * 2 + 1;
      if (uVar1 < ~(-1 << ((byte)height_00 & 0x1f)) + this->nTransactions >>
                  ((byte)height_00 & 0x1f)) {
        TraverseAndExtract((uint256 *)&local_78,this,height_00,uVar1,nBitsUsed,nHashUsed,vMatch,
                           vnIndex);
        bVar8 = ::operator==(&local_78,&left.super_base_blob<256U>);
        if (bVar8) {
          this->fBad = true;
        }
      }
      else {
        local_78.m_data._M_elems[0x10] = left.super_base_blob<256U>.m_data._M_elems[0x10];
        local_78.m_data._M_elems[0x11] = left.super_base_blob<256U>.m_data._M_elems[0x11];
        local_78.m_data._M_elems[0x12] = left.super_base_blob<256U>.m_data._M_elems[0x12];
        local_78.m_data._M_elems[0x13] = left.super_base_blob<256U>.m_data._M_elems[0x13];
        local_78.m_data._M_elems[0x14] = left.super_base_blob<256U>.m_data._M_elems[0x14];
        local_78.m_data._M_elems[0x15] = left.super_base_blob<256U>.m_data._M_elems[0x15];
        local_78.m_data._M_elems[0x16] = left.super_base_blob<256U>.m_data._M_elems[0x16];
        local_78.m_data._M_elems[0x17] = left.super_base_blob<256U>.m_data._M_elems[0x17];
        local_78.m_data._M_elems[0x18] = left.super_base_blob<256U>.m_data._M_elems[0x18];
        local_78.m_data._M_elems[0x19] = left.super_base_blob<256U>.m_data._M_elems[0x19];
        local_78.m_data._M_elems[0x1a] = left.super_base_blob<256U>.m_data._M_elems[0x1a];
        local_78.m_data._M_elems[0x1b] = left.super_base_blob<256U>.m_data._M_elems[0x1b];
        local_78.m_data._M_elems[0x1c] = left.super_base_blob<256U>.m_data._M_elems[0x1c];
        local_78.m_data._M_elems[0x1d] = left.super_base_blob<256U>.m_data._M_elems[0x1d];
        local_78.m_data._M_elems[0x1e] = left.super_base_blob<256U>.m_data._M_elems[0x1e];
        local_78.m_data._M_elems[0x1f] = left.super_base_blob<256U>.m_data._M_elems[0x1f];
        local_78.m_data._M_elems[0] = left.super_base_blob<256U>.m_data._M_elems[0];
        local_78.m_data._M_elems[1] = left.super_base_blob<256U>.m_data._M_elems[1];
        local_78.m_data._M_elems[2] = left.super_base_blob<256U>.m_data._M_elems[2];
        local_78.m_data._M_elems[3] = left.super_base_blob<256U>.m_data._M_elems[3];
        local_78.m_data._M_elems[4] = left.super_base_blob<256U>.m_data._M_elems[4];
        local_78.m_data._M_elems[5] = left.super_base_blob<256U>.m_data._M_elems[5];
        local_78.m_data._M_elems[6] = left.super_base_blob<256U>.m_data._M_elems[6];
        local_78.m_data._M_elems[7] = left.super_base_blob<256U>.m_data._M_elems[7];
        local_78.m_data._M_elems[8] = left.super_base_blob<256U>.m_data._M_elems[8];
        local_78.m_data._M_elems[9] = left.super_base_blob<256U>.m_data._M_elems[9];
        local_78.m_data._M_elems[10] = left.super_base_blob<256U>.m_data._M_elems[10];
        local_78.m_data._M_elems[0xb] = left.super_base_blob<256U>.m_data._M_elems[0xb];
        local_78.m_data._M_elems[0xc] = left.super_base_blob<256U>.m_data._M_elems[0xc];
        local_78.m_data._M_elems[0xd] = left.super_base_blob<256U>.m_data._M_elems[0xd];
        local_78.m_data._M_elems[0xe] = left.super_base_blob<256U>.m_data._M_elems[0xe];
        local_78.m_data._M_elems[0xf] = left.super_base_blob<256U>.m_data._M_elems[0xf];
      }
      Hash<uint256,uint256>(__return_storage_ptr__,&left,(uint256 *)&local_78);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
LAB_005801d4:
      __stack_chk_fail();
    }
  }
  else {
LAB_0058016b:
    this->fBad = true;
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) goto LAB_005801d4;
    pbVar7 = &__return_storage_ptr__->super_base_blob<256U>;
    (pbVar7->m_data)._M_elems[0x10] = '\0';
    (pbVar7->m_data)._M_elems[0x11] = '\0';
    (pbVar7->m_data)._M_elems[0x12] = '\0';
    (pbVar7->m_data)._M_elems[0x13] = '\0';
    (pbVar7->m_data)._M_elems[0x14] = '\0';
    (pbVar7->m_data)._M_elems[0x15] = '\0';
    (pbVar7->m_data)._M_elems[0x16] = '\0';
    (pbVar7->m_data)._M_elems[0x17] = '\0';
    pbVar7 = &__return_storage_ptr__->super_base_blob<256U>;
    (pbVar7->m_data)._M_elems[0x18] = '\0';
    (pbVar7->m_data)._M_elems[0x19] = '\0';
    (pbVar7->m_data)._M_elems[0x1a] = '\0';
    (pbVar7->m_data)._M_elems[0x1b] = '\0';
    (pbVar7->m_data)._M_elems[0x1c] = '\0';
    (pbVar7->m_data)._M_elems[0x1d] = '\0';
    (pbVar7->m_data)._M_elems[0x1e] = '\0';
    (pbVar7->m_data)._M_elems[0x1f] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[0] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[1] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[2] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[3] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[4] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[5] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[6] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[7] = '\0';
    pbVar7 = &__return_storage_ptr__->super_base_blob<256U>;
    (pbVar7->m_data)._M_elems[8] = '\0';
    (pbVar7->m_data)._M_elems[9] = '\0';
    (pbVar7->m_data)._M_elems[10] = '\0';
    (pbVar7->m_data)._M_elems[0xb] = '\0';
    (pbVar7->m_data)._M_elems[0xc] = '\0';
    (pbVar7->m_data)._M_elems[0xd] = '\0';
    (pbVar7->m_data)._M_elems[0xe] = '\0';
    (pbVar7->m_data)._M_elems[0xf] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

uint256 CPartialMerkleTree::TraverseAndExtract(int height, unsigned int pos, unsigned int &nBitsUsed, unsigned int &nHashUsed, std::vector<uint256> &vMatch, std::vector<unsigned int> &vnIndex) {
    if (nBitsUsed >= vBits.size()) {
        // overflowed the bits array - failure
        fBad = true;
        return uint256();
    }
    bool fParentOfMatch = vBits[nBitsUsed++];
    if (height==0 || !fParentOfMatch) {
        // if at height 0, or nothing interesting below, use stored hash and do not descend
        if (nHashUsed >= vHash.size()) {
            // overflowed the hash array - failure
            fBad = true;
            return uint256();
        }
        const uint256 &hash = vHash[nHashUsed++];
        if (height==0 && fParentOfMatch) { // in case of height 0, we have a matched txid
            vMatch.push_back(hash);
            vnIndex.push_back(pos);
        }
        return hash;
    } else {
        // otherwise, descend into the subtrees to extract matched txids and hashes
        uint256 left = TraverseAndExtract(height-1, pos*2, nBitsUsed, nHashUsed, vMatch, vnIndex), right;
        if (pos*2+1 < CalcTreeWidth(height-1)) {
            right = TraverseAndExtract(height-1, pos*2+1, nBitsUsed, nHashUsed, vMatch, vnIndex);
            if (right == left) {
                // The left and right branches should never be identical, as the transaction
                // hashes covered by them must each be unique.
                fBad = true;
            }
        } else {
            right = left;
        }
        // and combine them before returning
        return Hash(left, right);
    }
}